

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

WirehairResult __thiscall
wirehair::Codec::InitializeEncoder(Codec *this,uint64_t message_bytes,uint block_bytes)

{
  uint uVar1;
  bool bVar2;
  WirehairResult WVar3;
  uint uVar4;
  
  WVar3 = ChooseMatrix(this,message_bytes,block_bytes);
  if (WVar3 == Wirehair_Success) {
    uVar1 = this->_block_bytes;
    uVar4 = (uint)(message_bytes % (ulong)uVar1);
    if (message_bytes % (ulong)uVar1 == 0) {
      uVar4 = uVar1;
    }
    this->_input_final_bytes = uVar4;
    this->_output_final_bytes = uVar1;
    this->_extra_count = 0;
    this->_original_out_of_order = false;
    bVar2 = AllocateWorkspace(this);
    WVar3 = (uint)!bVar2 + (uint)!bVar2 * 8;
  }
  return WVar3;
}

Assistant:

WirehairResult Codec::InitializeEncoder(
    uint64_t message_bytes,
    unsigned block_bytes)
{
    WirehairResult result = ChooseMatrix(message_bytes, block_bytes);

    if (result == Wirehair_Success)
    {
        // Calculate partial final bytes
        unsigned partial_final_bytes = message_bytes % _block_bytes;
        if (partial_final_bytes <= 0) {
            partial_final_bytes = _block_bytes;
        }

        // Encoder-specific
        _input_final_bytes = partial_final_bytes;
        _output_final_bytes = _block_bytes;
        _extra_count = 0;
        _original_out_of_order = false;

        if (!AllocateWorkspace()) {
            result = Wirehair_OOM;
        }
    }

    return result;
}